

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<14UL>
mserialize::cx_strcat<4ul,4ul,5ul,1ul>
          (cx_string<4UL> *strings,cx_string<4UL> *strings_1,cx_string<5UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  cx_string<14UL> cVar4;
  char buffer [15];
  size_t size [5];
  char *data [5];
  
  pcVar1 = buffer;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  data[1] = strings->_data;
  data[2] = strings_1->_data;
  data[3] = strings_2->_data;
  data[4] = strings_3->_data;
  size[1] = 4;
  size[2] = 4;
  size[3] = 5;
  size[4] = 1;
  lVar2 = 1;
  do {
    if (size[lVar2] != 0) {
      uVar3 = 0;
      do {
        pcVar1[uVar3] = data[lVar2][uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < size[lVar2]);
      pcVar1 = pcVar1 + uVar3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  cVar4._data[7] = buffer[7];
  cVar4._data[0] = buffer[0];
  cVar4._data[1] = buffer[1];
  cVar4._data[2] = buffer[2];
  cVar4._data[3] = buffer[3];
  cVar4._data[4] = buffer[4];
  cVar4._data[5] = buffer[5];
  cVar4._data[6] = buffer[6];
  cVar4._data[8] = buffer[8];
  cVar4._data[9] = buffer[9];
  cVar4._data[10] = buffer[10];
  cVar4._data[0xb] = buffer[0xb];
  cVar4._data[0xc] = buffer[0xc];
  cVar4._data[0xd] = buffer[0xd];
  cVar4._data[0xe] = '\0';
  return (cx_string<14UL>)cVar4._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}